

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O3

bool __thiscall
units::precise_measurement::operator==(precise_measurement *this,precise_measurement *other)

{
  bool bVar1;
  double otherval;
  precise_unit local_28;
  
  local_28.multiplier_ = (other->units_).multiplier_;
  local_28.base_units_ = (other->units_).base_units_;
  local_28.commodity_ = (other->units_).commodity_;
  bVar1 = precise_unit::operator==(&this->units_,&local_28);
  if (bVar1) {
    otherval = other->value_;
  }
  else {
    otherval = value_as(other,&this->units_);
  }
  bVar1 = valueEqualityCheck(this,otherval);
  return bVar1;
}

Assistant:

bool operator==(const precise_measurement& other) const
    {
        return valueEqualityCheck(
            (units_ == other.units()) ? other.value() : other.value_as(units_));
    }